

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O1

string * fs_get_owner_group_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  group *pgVar4;
  char *__file;
  __gid_t _Var5;
  string_view fname;
  statx sx;
  stat sStack_1a8;
  allocator<char> local_118 [24];
  __gid_t local_100;
  
  __file = path._M_str;
  _Var5 = 0xffffff9c;
  iVar2 = statx(0xffffff9c,__file,0x800,0x10,local_118);
  if (iVar2 == 0) {
    bVar1 = true;
    sStack_1a8.st_gid = local_100;
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0x26) {
      iVar2 = stat(__file,&sStack_1a8);
      _Var5 = (__gid_t)__file;
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_0010f449;
      }
    }
    sStack_1a8.st_gid = _Var5;
    bVar1 = false;
  }
LAB_0010f449:
  if ((bVar1) && (pgVar4 = getgrgid(sStack_1a8.st_gid), pgVar4 != (group *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pgVar4->gr_name,local_118);
    return __return_storage_ptr__;
  }
  fname._M_str = "fs_get_owner_group";
  fname._M_len = 0x12;
  fs_print_error(path,fname);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_group(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, true); !s.empty())
    return s;
#else
  if (auto gid = fs_stat_gid(path)) {
    if (auto gr = getgrgid(gid.value()))
      return gr->gr_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}